

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcompress.c
# Opt level: O3

int compress2mem_from_mem
              (char *inmemptr,size_t inmemsize,char **buffptr,size_t *buffsize,
              _func_void_ptr_void_ptr_size_t *mem_realloc,size_t *filesize,int *status)

{
  int iVar1;
  char *pcVar2;
  char *local_a0;
  undefined4 local_98;
  char *local_88;
  undefined4 local_80;
  size_t local_78;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  
  iVar1 = *status;
  if (iVar1 < 1) {
    local_60 = 0;
    uStack_58 = 0;
    local_50 = 0;
    iVar1 = deflateInit2_(&local_a0,1,8,0x1f,8,0,"1.2.11",0x70);
    if (iVar1 == 0) {
      local_98 = (undefined4)inmemsize;
      local_88 = *buffptr;
      local_80 = (undefined4)*buffsize;
      local_a0 = inmemptr;
      while (iVar1 = deflate(&local_a0,4), iVar1 == 0) {
        if (mem_realloc == (_func_void_ptr_void_ptr_size_t *)0x0) goto LAB_001c2faa;
        pcVar2 = (char *)(*mem_realloc)(*buffptr,*buffsize + 0x7080);
        *buffptr = pcVar2;
        if (pcVar2 == (char *)0x0) goto LAB_001c2faa;
        local_80 = 0x7080;
        local_88 = pcVar2 + *buffsize;
        *buffsize = *buffsize + 0x7080;
      }
      if (iVar1 == 1) {
        if (filesize != (size_t *)0x0) {
          *filesize = local_78;
        }
        iVar1 = deflateEnd(&local_a0);
        if (iVar1 == 0) {
          return *status;
        }
        *status = 0x19d;
      }
      else {
LAB_001c2faa:
        deflateEnd(&local_a0);
        *status = 0x19d;
      }
    }
    else {
      *status = 0x19d;
    }
    iVar1 = 0x19d;
  }
  return iVar1;
}

Assistant:

int compress2mem_from_mem(                                                
             char *inmemptr,     /* I - memory pointer to uncompressed bytes */
             size_t inmemsize,   /* I - size of input uncompressed file      */
             char **buffptr,   /* IO - memory pointer for compressed file    */
             size_t *buffsize,   /* IO - size of buffer, in bytes           */
             void *(*mem_realloc)(void *p, size_t newsize), /* function     */
             size_t *filesize,   /* O - size of file, in bytes              */
             int *status)        /* IO - error status                       */

/*
  Compress the file into memory.  Fill whatever amount of memory has
  already been allocated, then realloc more memory, using the supplied
  input function, if necessary.
*/
{
    int err;
    z_stream c_stream;  /* compression stream */

    if (*status > 0)
        return(*status);

    c_stream.zalloc = (alloc_func)0;
    c_stream.zfree = (free_func)0;
    c_stream.opaque = (voidpf)0;

    /* Initialize the compression.  The argument (15+16) tells the 
       compressor that we are to use the gzip algorythm.
       Also use Z_BEST_SPEED for maximum speed with very minor loss
       in compression factor. */
    err = deflateInit2(&c_stream, Z_BEST_SPEED, Z_DEFLATED,
                       (15+16), 8, Z_DEFAULT_STRATEGY);

    if (err != Z_OK) return(*status = 413);

    c_stream.next_in = (unsigned char*)inmemptr;
    c_stream.avail_in = inmemsize;

    c_stream.next_out = (unsigned char*) *buffptr;
    c_stream.avail_out = *buffsize;

    for (;;) {
        /* compress as much of the input as will fit in the output */
        err = deflate(&c_stream, Z_FINISH);

        if (err == Z_STREAM_END) {  /* We reached the end of the input */
	   break;
        } else if (err == Z_OK ) { /* need more space in output buffer */

            if (mem_realloc) {   
                *buffptr = mem_realloc(*buffptr,*buffsize + BUFFINCR);
                if (*buffptr == NULL){
                    deflateEnd(&c_stream);
                    return(*status = 413);  /* memory allocation failed */
                }

                c_stream.avail_out = BUFFINCR;
                c_stream.next_out = (unsigned char*) (*buffptr + *buffsize);
                *buffsize = *buffsize + BUFFINCR;

            } else  { /* error: no realloc function available */
                deflateEnd(&c_stream);
                return(*status = 413);
            }
        } else {  /* some other error */
            deflateEnd(&c_stream);
            return(*status = 413);
        }
    }

    /* Set the output file size to be the total output data */
    if (filesize) *filesize = c_stream.total_out;

    /* End the compression */
    err = deflateEnd(&c_stream);

    if (err != Z_OK) return(*status = 413);
     
    return(*status);
}